

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

void encodeAutoHeader(char *result,EncodeRec *enc,int m,int extraDigits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int dividery_00;
  TerritoryBoundary *pTVar7;
  long lVar8;
  bool bVar9;
  int value;
  int codexlen;
  int extray;
  int vy;
  int dividery;
  int extrax;
  int vx;
  int dividerx;
  int GOODROUNDER;
  int codexm;
  int firstindex;
  TerritoryBoundary *b;
  int product;
  int xdiv;
  int H;
  int W;
  int STORAGE_START;
  int i;
  int extraDigits_local;
  int m_local;
  EncodeRec *enc_local;
  char *result_local;
  
  H = 0;
  iVar2 = coDex(m);
  GOODROUNDER = m;
  while( true ) {
    bVar9 = false;
    if (1 < (TERRITORY_BOUNDARIES[GOODROUNDER + -1].flags >> 7 & 3U)) {
      iVar3 = coDex(GOODROUNDER + -1);
      bVar9 = iVar3 == iVar2;
    }
    if (!bVar9) break;
    GOODROUNDER = GOODROUNDER + -1;
  }
  W = GOODROUNDER;
  while( true ) {
    lVar8 = (long)W;
    pTVar7 = TERRITORY_BOUNDARIES + lVar8;
    iVar3 = TERRITORY_BOUNDARIES[lVar8].maxy;
    iVar5 = TERRITORY_BOUNDARIES[lVar8].miny;
    iVar4 = xDivider4(TERRITORY_BOUNDARIES[lVar8].miny,TERRITORY_BOUNDARIES[lVar8].maxy);
    iVar3 = ((((iVar3 - iVar5) + 0x59) / 0x5a + 0xaf) / 0xb0) * 0xb0;
    iVar5 = ((((TERRITORY_BOUNDARIES[lVar8].maxx - pTVar7->minx) * 4 + iVar4 + -1) / iVar4 + 0xa7) /
            0xa8) * 0xa8;
    b._0_4_ = (iVar5 / 0xa8) * (iVar3 / 0xb0) * 0x745f;
    if ((TERRITORY_BOUNDARIES[W].flags >> 7 & 3U) == 2) {
      iVar4 = 0xe1781;
      if (0x16 < iVar2) {
        iVar4 = 0x1b4d89f;
      }
      b._0_4_ = ((H + (int)b + iVar4 + -1) / iVar4) * iVar4 - H;
    }
    if (W == m) break;
    H = (int)b + H;
    W = W + 1;
  }
  iVar5 = ((TERRITORY_BOUNDARIES[lVar8].maxx - pTVar7->minx) + iVar5 + -1) / iVar5;
  iVar6 = ((enc->coord32).lonMicroDeg - pTVar7->minx) / iVar5;
  iVar4 = (enc->coord32).lonMicroDeg;
  iVar1 = pTVar7->minx;
  dividery_00 = ((TERRITORY_BOUNDARIES[lVar8].maxy - TERRITORY_BOUNDARIES[lVar8].miny) + iVar3 + -1)
                / iVar3;
  codexlen = (TERRITORY_BOUNDARIES[lVar8].maxy - (enc->coord32).latMicroDeg) / dividery_00;
  value = (TERRITORY_BOUNDARIES[lVar8].maxy - (enc->coord32).latMicroDeg) % dividery_00;
  iVar2 = iVar2 / 10 + iVar2 % 10;
  if ((value == 0) && (0 < enc->fraclat)) {
    codexlen = codexlen + -1;
    value = dividery_00;
  }
  encodeBase31(result,H / 0x745f + codexlen / 0xb0 + (iVar6 / 0xa8) * (iVar3 / 0xb0),iVar2 + -2);
  result[iVar2 + -2] = '.';
  encodeTriple(result + (long)iVar2 + -1,iVar6 % 0xa8,codexlen % 0xb0);
  encodeExtension(result,(iVar4 - iVar1) % iVar5 << 2,value,iVar5 << 2,dividery_00,extraDigits,-1,
                  enc);
  return;
}

Assistant:

static void encodeAutoHeader(char *result, const EncodeRec *enc, const int m, const int extraDigits) {
    int i;
    int STORAGE_START = 0;
    int W, H, xdiv, product;
    const TerritoryBoundary *b;

    // search back to first of the group
    int firstindex = m;
    const int codexm = coDex(m);
    ASSERT(result);
    ASSERT(enc);
    ASSERT((1 <= m) && (m <= MAPCODE_BOUNDARY_MAX));
    ASSERT((0 <= extraDigits) && (extraDigits <= MAX_PRECISION_DIGITS));

    while (REC_TYPE(firstindex - 1) > 1 && coDex(firstindex - 1) == codexm) {
        firstindex--;
    }

    i = firstindex;
    for (;;) {
        b = TERRITORY_BOUNDARY(i);
        // determine how many cells
        H = (b->maxy - b->miny + 89) / 90; // multiple of 10m
        xdiv = xDivider4(b->miny, b->maxy);
        W = ((b->maxx - b->minx) * 4 + (xdiv - 1)) / xdiv;

        // round up to multiples of 176*168...
        H = 176 * ((H + 176 - 1) / 176);
        W = 168 * ((W + 168 - 1) / 168);
        product = (W / 168) * (H / 176) * 961 * 31;
        if (REC_TYPE(i) == 2) { // plus pipe
            const int GOODROUNDER = codexm >= 23 ? (961 * 961 * 31) : (961 * 961);
            product = ((STORAGE_START + product + GOODROUNDER - 1) / GOODROUNDER) * GOODROUNDER - STORAGE_START;
        }
        if (i == m) {
            // encode
            const int dividerx = (b->maxx - b->minx + W - 1) / W;
            const int vx = (enc->coord32.lonMicroDeg - b->minx) / dividerx;
            const int extrax = (enc->coord32.lonMicroDeg - b->minx) % dividerx;

            const int dividery = (b->maxy - b->miny + H - 1) / H;
            int vy = (b->maxy - enc->coord32.latMicroDeg) / dividery;
            int extray = (b->maxy - enc->coord32.latMicroDeg) % dividery;

            const int codexlen = (codexm / 10) + (codexm % 10);
            int value = (vx / 168) * (H / 176);

            if (extray == 0 && enc->fraclat > 0) {
                vy--;
                extray += dividery;
            }

            value += (vy / 176);

            // PIPELETTER ENCODE
            encodeBase31(result, (STORAGE_START / (961 * 31)) + value, codexlen - 2);
            result[codexlen - 2] = '.';
            encodeTriple(result + codexlen - 1, vx % 168, vy % 176);

            encodeExtension(result, extrax << 2, extray, dividerx << 2, dividery, extraDigits, -1, enc); // autoheader
            return;
        }
        STORAGE_START += product;
        i++;
    }
}